

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O3

bool cc::sendSimple(Connection *conn,Type type,Namespace urn)

{
  uint __val;
  bool bVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 uVar9;
  uint __len;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar9 = s_verbose;
  if ((int)type < 5 && (int)urn < 4) {
    if (type == GetStatus) {
      iVar2 = std::__cxx11::string::compare((char *)&mediaSession_abi_cxx11_);
      uVar9 = s_verbose;
      if (iVar2 != 0) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"urn:x-cast:com.google.cast.media","");
        __val = -s_requestId;
        if (0 < (int)s_requestId) {
          __val = s_requestId;
        }
        __len = 1;
        if (9 < __val) {
          uVar7 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar4 = (uint)uVar7;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_00107f9e;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_00107f9e;
            }
            if (uVar4 < 10000) goto LAB_00107f9e;
            uVar7 = uVar7 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_00107f9e:
        uVar8 = s_requestId >> 0x1f;
        iVar2 = (int)s_requestId >> 0x1f;
        s_requestId = s_requestId + 1;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)iVar2);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar8 + (long)local_50[0]),__len,__val);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11e551);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_60 = *plVar5;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar5;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_a0 = *plVar5;
          lStack_98 = plVar3[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar5;
          local_b0 = (long *)*plVar3;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,mediaSession_abi_cxx11_);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_80 = *plVar5;
          lStack_78 = plVar3[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar5;
          local_90 = (long *)*plVar3;
        }
        local_88 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar6 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = plVar3[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_d0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        bVar1 = sendMessage(conn,&local_f0,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return bVar1;
        }
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        return bVar1;
      }
    }
    else if (type - Ping < 2) {
      s_verbose = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               _ZN2cc2nsL7stringsE_rel + *(int *)(_ZN2cc2nsL7stringsE_rel + (ulong)urn * 4),
               (allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               _ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
               *(int *)(_ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
                       (ulong)type * 4),(allocator<char> *)&local_b0);
    bVar1 = sendMessage(conn,&local_f0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  s_verbose = (bool)uVar9;
  return bVar1;
}

Assistant:

bool sendSimple(const Connection &conn, const msg::Type type, const ns::Namespace urn)
{
    static const char *msgs[msg::SimpleMessageCount] = {
        "{\"type\": \"CONNECT\"}",
        "{\"type\": \"PING\"}",
        "{\"type\": \"PONG\"}",
        "{\"type\": \"GET_STATUS\", \"requestId\": 1}",
        "{\"type\": \"MEDIA_STATUS\"}"
    };

    if (urn >= ns::NamespacesCount) {
        return false;
    }
    if (type >= msg::SimpleMessageCount) {
        return false;
    }
    if (type == msg::GetStatus && mediaSession != "") {
        return sendMessage(conn,
                ns::strings[ns::Media],
                "{ "
                " \"type\": \"GET_STATUS\", "
                " \"requestId\": " + std::to_string(s_requestId++) + ", "
                " \"mediaSessionId\": \"" + mediaSession + "\""
                "}"
            );
    }

    const bool wasVerbose = s_verbose;
    if (type == msg::Ping || type == msg::Pong) {
        // too much spam
        s_verbose = false;
    }
    const bool ret = sendMessage(conn, ns::strings[urn], msgs[type]);
    s_verbose = wasVerbose;
    return ret;
}